

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall net_uv::Buffer::add(Buffer *this,char *pData,uint32_t dataLen)

{
  uint uVar1;
  block *pbVar2;
  block *pbVar3;
  char *pcVar4;
  char *curData;
  uint uVar5;
  
  if (dataLen != 0) {
    do {
      pbVar2 = this->m_tailBlock;
      uVar5 = this->m_blockSize;
      if (uVar5 <= pbVar2->dataLen) {
        pbVar3 = (block *)malloc(0x20);
        pbVar3->dataLen = 0;
        pbVar3->pre = (block *)0x0;
        pbVar3->next = (block *)0x0;
        pcVar4 = (char *)malloc((ulong)uVar5);
        pbVar3->data = pcVar4;
        pbVar2->next = pbVar3;
        pbVar3->pre = pbVar2;
        this->m_tailBlock = pbVar3;
      }
      uVar1 = this->m_tailBlock->dataLen;
      uVar5 = uVar5 - uVar1;
      if (dataLen <= uVar5) {
        uVar5 = dataLen;
      }
      memcpy(this->m_tailBlock->data + uVar1,pData,(ulong)uVar5);
      this->m_tailBlock->dataLen = this->m_tailBlock->dataLen + uVar5;
      this->m_curDataLength = this->m_curDataLength + uVar5;
      pData = pData + uVar5;
      dataLen = dataLen - uVar5;
    } while (dataLen != 0);
  }
  return;
}

Assistant:

void add(char* pData, uint32_t dataLen)
	{
		char* curData = pData;
		while (dataLen > 0)
		{
			// create a new node
			if (m_tailBlock->dataLen >= m_blockSize)
			{
				block* b = createBlock();
				m_tailBlock->next = b;
				b->pre = m_tailBlock;
				m_tailBlock = b;
			}
			uint32_t sub = m_blockSize - m_tailBlock->dataLen;
			uint32_t copylen = (sub > dataLen) ? dataLen : sub;

			memcpy(m_tailBlock->data + m_tailBlock->dataLen, curData, copylen);

			m_tailBlock->dataLen += copylen;
			m_curDataLength += copylen;
			curData = curData + copylen;
			dataLen -= copylen;
		}
	}